

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O3

void ExpectPKCS12Parse(Span<const_unsigned_char> in,EVP_PKEY *expect_key,X509 *expect_cert,
                      vector<x509_st_*,_std::allocator<x509_st_*>_> *expect_ca_certs)

{
  X509 *a;
  int iVar1;
  pointer ppxVar2;
  X509 *b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar5;
  char *message;
  pointer pcVar6;
  char *in_R9;
  pointer *__ptr_1;
  pointer *__ptr;
  size_t i;
  EVP_PKEY *key;
  X509 *cert;
  UniquePtr<X509> delete_cert;
  UniquePtr<EVP_PKEY> delete_key;
  UniquePtr<PKCS12> p12;
  stack_st_X509 *ca_certs;
  UniquePtr<struct_stack_st_X509> delete_ca_certs;
  UniquePtr<BIO> bio;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  AssertHelper local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  AssertHelper local_68;
  unique_ptr<x509_st,_bssl::internal::Deleter> local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  _Head_base<0UL,_stack_st_X509_*,_false> local_48;
  unique_ptr<stack_st_X509,_bssl::internal::Deleter> local_40;
  unique_ptr<bio_st,_bssl::internal::Deleter> local_38;
  
  local_38._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
                 BIO_new_mem_buf(in.data_,(int)in.size_);
  local_a8._M_head_impl._0_1_ =
       (tuple<bio_st_*,_bssl::internal::Deleter>)
       local_38._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl != (_Head_base<0UL,_bio_st_*,_false>)0x0;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((tuple<bio_st_*,_bssl::internal::Deleter>)
      local_38._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl == (_Head_base<0UL,_bio_st_*,_false>)0x0)
  {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&local_a8,(AssertionResult *)0x596543,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x20c,(char *)CONCAT71(local_98._1_7_,local_98[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
    }
    if ((PKCS12 *)local_50._M_head_impl != (PKCS12 *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
    goto LAB_00348a05;
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       d2i_PKCS12_bio((BIO *)local_38._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,(PKCS12 **)0x0);
  local_a8._M_head_impl._0_1_ = (PKCS12 *)local_50._M_head_impl != (PKCS12 *)0x0;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((PKCS12 *)local_50._M_head_impl == (PKCS12 *)0x0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&local_a8,(AssertionResult *)0x55cfa5,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x20f,(char *)CONCAT71(local_98._1_7_,local_98[0]));
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    _Var4._M_head_impl = local_70._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      _Var4._M_head_impl = local_70._M_head_impl;
    }
LAB_00348411:
    if ((EVP_PKEY *)_Var4._M_head_impl != (EVP_PKEY *)0x0) {
      (**(code **)(*(long *)_Var4._M_head_impl + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  else {
    local_70._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_68.data_ = (AssertHelperData *)0x0;
    local_48._M_head_impl = (stack_st_X509 *)0x0;
    iVar1 = PKCS12_parse((PKCS12 *)local_50._M_head_impl,"foo",(EVP_PKEY **)&local_70,
                         (X509 **)&local_68,(stack_st_X509 **)&local_48);
    _Var4._M_head_impl = local_a8._M_head_impl;
    local_a8._M_head_impl._0_1_ = iVar1 != 0;
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)&local_a8,
                 (AssertionResult *)"PKCS12_parse(p12.get(), kPassword, &key, &cert, &ca_certs)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x214,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
      _Var4._M_head_impl = local_58._M_head_impl;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
        _Var4._M_head_impl = local_58._M_head_impl;
      }
      goto LAB_00348411;
    }
    local_58._M_head_impl = local_70._M_head_impl;
    local_60._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)local_68.data_;
    local_40._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
         (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)local_48._M_head_impl;
    if (expect_key == (EVP_PKEY *)0x0) {
      local_a8._M_head_impl._0_1_ = (EVP_PKEY *)local_70._M_head_impl == (EVP_PKEY *)0x0;
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((EVP_PKEY *)local_70._M_head_impl != (EVP_PKEY *)0x0) {
        pdVar5 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0;
        testing::Message::Message((Message *)&local_b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_98,(internal *)&local_a8,(AssertionResult *)0x5e57b2,"true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x21b,(char *)CONCAT71(local_98._1_7_,local_98[0]));
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1
                         );
        }
        if (local_b0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_b0._M_head_impl + 8))();
        }
        pbVar3 = local_a0;
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_003485bc;
      }
LAB_003485c1:
      _Var4._M_head_impl = local_a8._M_head_impl;
      if (expect_cert == (X509 *)0x0) {
        local_a8._M_head_impl._0_1_ = (X509 *)local_68.data_ == (X509 *)0x0;
        local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((X509 *)local_68.data_ != (X509 *)0x0) {
          pdVar5 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0;
          testing::Message::Message((Message *)&local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_98,(internal *)&local_a8,(AssertionResult *)0x5a4ed4,"true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x222,(char *)CONCAT71(local_98._1_7_,local_98[0]));
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_b0);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_98._1_7_,local_98[0]),
                            local_88._M_allocated_capacity + 1);
          }
          if (local_b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b0._M_head_impl + 8))();
          }
          pbVar3 = local_a0;
          if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          goto LAB_00348810;
        }
      }
      else {
        local_a8._M_head_impl._0_1_ = (X509 *)local_68.data_ != (X509 *)0x0;
        local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((X509 *)local_68.data_ == (X509 *)0x0) {
          testing::Message::Message((Message *)&local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_98,(internal *)&local_a8,(AssertionResult *)0x5a4ed4,"false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x224,(char *)CONCAT71(local_98._1_7_,local_98[0]));
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_b0);
          goto LAB_0034876b;
        }
        local_a8._M_head_impl = _Var4._M_head_impl & 0xffffffff00000000;
        iVar1 = X509_cmp((X509 *)local_68.data_,(X509 *)expect_cert);
        local_b0._M_head_impl._0_4_ = iVar1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_98,"0","X509_cmp(cert, expect_cert)",(int *)&local_a8,
                   (int *)&local_b0);
        if (local_98[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_a8);
          if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_90->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x225,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_a8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
          if (local_a8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_a8._M_head_impl + 8))();
          }
        }
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pdVar5 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90;
          pbVar3 = local_90;
LAB_00348810:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(pdVar5,pbVar3);
        }
      }
      local_a8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)(expect_ca_certs->super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(expect_ca_certs->super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3);
      local_b0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           OPENSSL_sk_num((OPENSSL_STACK *)local_48._M_head_impl);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_98,"expect_ca_certs.size()","sk_X509_num(ca_certs)",
                 (unsigned_long *)&local_a8,(unsigned_long *)&local_b0);
      if (local_98[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_a8);
        if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = (local_90->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x228,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
        if (local_a8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_a8._M_head_impl + 8))();
        }
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pdVar5 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90;
          goto LAB_003489d8;
        }
      }
      else {
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_90,local_90);
        }
        ppxVar2 = (expect_ca_certs->super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if ((expect_ca_certs->super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>)._M_impl.
            super__Vector_impl_data._M_finish != ppxVar2) {
          i = 0;
          do {
            local_a8._M_head_impl = local_a8._M_head_impl & 0xffffffff00000000;
            a = (X509 *)ppxVar2[i];
            b = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)local_48._M_head_impl,i);
            iVar1 = X509_cmp(a,b);
            local_b0._M_head_impl._0_4_ = iVar1;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_98,"0",
                       "X509_cmp(expect_ca_certs[i], sk_X509_value(ca_certs, i))",(int *)&local_a8,
                       (int *)&local_b0);
            if (local_98[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_a8);
              message = "";
              if (local_90 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                message = (local_90->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                         ,0x22a,message);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_b0,(Message *)&local_a8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
              if (local_a8._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_a8._M_head_impl + 8))();
              }
            }
            if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_90,local_90);
            }
            i = i + 1;
            ppxVar2 = (expect_ca_certs->super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (i < (ulong)((long)(expect_ca_certs->
                                     super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)ppxVar2 >> 3)
                  );
        }
      }
    }
    else {
      local_a8._M_head_impl._0_1_ = (EVP_PKEY *)local_70._M_head_impl != (EVP_PKEY *)0x0;
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((EVP_PKEY *)local_70._M_head_impl != (EVP_PKEY *)0x0) {
        local_a8._M_head_impl._4_4_ = SUB84(_Var4._M_head_impl,4);
        local_a8._M_head_impl._0_4_ = 1;
        iVar1 = EVP_PKEY_cmp((EVP_PKEY *)local_70._M_head_impl,(EVP_PKEY *)expect_key);
        local_b0._M_head_impl._0_4_ = iVar1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_98,"1","EVP_PKEY_cmp(key, expect_key)",(int *)&local_a8,
                   (int *)&local_b0);
        if (local_98[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_a8);
          if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_90->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x21e,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_a8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
          if (local_a8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_a8._M_head_impl + 8))();
          }
        }
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pdVar5 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90;
          pbVar3 = local_90;
LAB_003485bc:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(pdVar5,pbVar3);
        }
        goto LAB_003485c1;
      }
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)&local_a8,(AssertionResult *)0x5e57b2,"false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x21d,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_b0);
LAB_0034876b:
      pdVar5 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a0;
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
      local_90 = local_a0;
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_003489d8:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(pdVar5,local_90);
      }
    }
    std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&local_40);
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_60);
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_58);
  }
  std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)&local_50);
LAB_00348a05:
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&local_38);
  return;
}

Assistant:

static void ExpectPKCS12Parse(bssl::Span<const uint8_t> in,
                              EVP_PKEY *expect_key, X509 *expect_cert,
                              const std::vector<X509 *> &expect_ca_certs) {
  bssl::UniquePtr<BIO> bio(BIO_new_mem_buf(in.data(), in.size()));
  ASSERT_TRUE(bio);

  bssl::UniquePtr<PKCS12> p12(d2i_PKCS12_bio(bio.get(), nullptr));
  ASSERT_TRUE(p12);

  EVP_PKEY *key = nullptr;
  X509 *cert = nullptr;
  STACK_OF(X509) *ca_certs = nullptr;
  ASSERT_TRUE(PKCS12_parse(p12.get(), kPassword, &key, &cert, &ca_certs));

  bssl::UniquePtr<EVP_PKEY> delete_key(key);
  bssl::UniquePtr<X509> delete_cert(cert);
  bssl::UniquePtr<STACK_OF(X509)> delete_ca_certs(ca_certs);

  if (expect_key == nullptr) {
    EXPECT_FALSE(key);
  } else {
    ASSERT_TRUE(key);
    EXPECT_EQ(1, EVP_PKEY_cmp(key, expect_key));
  }

  if (expect_cert == nullptr) {
    EXPECT_FALSE(cert);
  } else {
    ASSERT_TRUE(cert);
    EXPECT_EQ(0, X509_cmp(cert, expect_cert));
  }

  ASSERT_EQ(expect_ca_certs.size(), sk_X509_num(ca_certs));
  for (size_t i = 0; i < expect_ca_certs.size(); i++) {
    EXPECT_EQ(0, X509_cmp(expect_ca_certs[i], sk_X509_value(ca_certs, i)));
  }
}